

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O2

void __thiscall Screen::indicateMoreText(Screen *this)

{
  string formattedInput;
  char inputText [100];
  
  formattedInput._M_dataplus._M_p = (pointer)&formattedInput.field_2;
  formattedInput._M_string_length = 0;
  formattedInput.field_2._M_local_buf[0] = '\0';
  inputText[0] = '\0';
  wclear(this->inputScreen);
  wrefresh(this->inputScreen);
  mvwprintw(this->inputScreen,1,1,"> ");
  wprintw(this->inputScreen,"[MORE TEXT, PRESS ENTER]");
  wgetnstr(this->inputScreen,inputText,0xffffffffffffffff);
  std::__cxx11::string::~string((string *)&formattedInput);
  return;
}

Assistant:

void Screen::indicateMoreText() {
    std::string formattedInput;
    char inputText[MAX_INPUT_LENGTH];
    inputText[0] = '\0';

    // Clear the input area
    clearWindow(inputScreen);
    wrefresh(inputScreen);

    // Move the cursor to the correct location
    mvwprintw(inputScreen, 1, 1, "> ");
    wprintw(inputScreen, "[MORE TEXT, PRESS ENTER]");
    // Get a string of console input
    wgetstr(inputScreen, inputText);
}